

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpn_lex.hpp
# Opt level: O2

front_insert_iterator<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
 __thiscall
util::Lexer::
Lex<std::front_insert_iterator<std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
          (Lexer *this,
          front_insert_iterator<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          it)

{
  string t;
  value_type local_60;
  string local_40;
  
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  ReadToken_abi_cxx11_(&local_40,this);
  while( true ) {
    std::__cxx11::string::operator=((string *)&local_60,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    if (local_60._M_string_length == 0) break;
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_front(it.container,&local_60);
    ReadToken_abi_cxx11_(&local_40,this);
  }
  std::__cxx11::string::~string((string *)&local_60);
  return (front_insert_iterator<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          )(front_insert_iterator<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            )it.container;
}

Assistant:

IT Lex(IT it)
			{
				std::string t;

				for (t = ReadToken(); !t.empty(); t = ReadToken())
					*it++ = t;

				return it;
			}